

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_handle.cpp
# Opt level: O0

vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_> *
__thiscall
libtorrent::torrent_handle::
sync_call_ret<std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>,std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>(libtorrent::aux::torrent::*)()const>
          (vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
           *__return_storage_ptr__,torrent_handle *this,
          vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
          *def,offset_in_torrent_to_subr f)

{
  bool bVar1;
  element_type *this_00;
  session_impl *this_01;
  io_context *ctx;
  undefined8 uVar2;
  undefined1 local_c8 [8];
  type_conflict5 local_c0;
  exception_ptr local_80;
  exception_ptr ex;
  bool done;
  session_impl *ses;
  undefined1 local_50 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  offset_in_torrent_to_subr f_local;
  vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
  *def_local;
  torrent_handle *this_local;
  vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_> *r;
  
  t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)f;
  ::std::weak_ptr<libtorrent::aux::torrent>::lock((weak_ptr<libtorrent::aux::torrent> *)local_50);
  ::std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
  ::vector(__return_storage_ptr__,def);
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_50);
  if (!bVar1) {
    throw_invalid_handle();
  }
  this_00 = ::std::
            __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_50);
  this_01 = (session_impl *)libtorrent::aux::torrent::session(this_00);
  ex._M_exception_object._7_1_ = 0;
  ::std::__exception_ptr::exception_ptr::exception_ptr(&local_80);
  ctx = libtorrent::aux::session_impl::get_context(this_01);
  local_c0.done = (bool *)((long)&ex._M_exception_object + 7);
  local_c0.r = __return_storage_ptr__;
  local_c0.ses = this_01;
  local_c0.ex = &local_80;
  ::std::shared_ptr<libtorrent::aux::torrent>::shared_ptr
            (&local_c0.t,(shared_ptr<libtorrent::aux::torrent> *)local_50);
  local_c0.f = (offset_in_torrent_to_subr)
               t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
  boost::asio::
  dispatch<boost::asio::io_context,libtorrent::torrent_handle::sync_call_ret<std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>,std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>(libtorrent::aux::torrent::*)()const>(std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>,std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>(libtorrent::aux::torrent::*)()const)const::_lambda()_1_>
            (ctx,&local_c0,(type *)0x0);
  const::{lambda()#1}::~sync_call_ret((_lambda___1_ *)&local_c0);
  libtorrent::aux::torrent_wait((bool *)((long)&ex._M_exception_object + 7),this_01);
  bVar1 = ::std::__exception_ptr::exception_ptr::operator_cast_to_bool(&local_80);
  if (bVar1) {
    ::std::__exception_ptr::exception_ptr::exception_ptr((exception_ptr *)local_c8,&local_80);
    uVar2 = ::std::rethrow_exception((exception_ptr)local_c8);
    const::{lambda()#1}::~sync_call_ret((_lambda___1_ *)&local_c0);
    ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_80);
    ::std::
    vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>::
    ~vector(__return_storage_ptr__);
    ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
              ((shared_ptr<libtorrent::aux::torrent> *)local_50);
    _Unwind_Resume(uVar2);
  }
  ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_80);
  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)local_50);
  return __return_storage_ptr__;
}

Assistant:

Ret torrent_handle::sync_call_ret(Ret def, Fun f, Args&&... a) const
	{
		auto t = m_torrent.lock();
		Ret r = def;
#ifndef BOOST_NO_EXCEPTIONS
		if (!t) throw_invalid_handle();
#else
		if (!t) return r;
#endif
		auto& ses = static_cast<session_impl&>(t->session());

		// this is the flag to indicate the call has completed
		bool done = false;

		std::exception_ptr ex;
		dispatch(ses.get_context(), [=,&r,&done,&ses,&ex] ()
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				r = (t.get()->*f)(std::move(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (...) {
				ex = std::current_exception();
			}
#endif
			std::unique_lock<std::mutex> l(ses.mut);
			done = true;
			ses.cond.notify_all();
		} );

		aux::torrent_wait(done, ses);

		if (ex) std::rethrow_exception(ex);
		return r;
	}